

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseLengthDelimited
          (UnknownFieldLiteParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint res;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  pair<const_char_*,_int> pVar5;
  
  res = (uint)(byte)*ptr;
  if (*ptr < '\0') {
    pVar5 = ReadSizeFallback(ptr,res);
    pcVar2 = pVar5.first;
    res = pVar5.second;
  }
  else {
    pcVar2 = ptr + 1;
  }
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (this->unknown_ != (string *)0x0) {
      uVar4 = (ulong)(num * 8 + 2);
      cVar3 = (char)this->unknown_;
      if (0x7f < num << 3) {
        do {
          std::__cxx11::string::push_back(cVar3);
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar4 >> 7;
        } while (bVar1);
      }
      std::__cxx11::string::push_back(cVar3);
      uVar4 = (ulong)(int)res;
      cVar3 = (char)this->unknown_;
      if (0x7f < res) {
        do {
          std::__cxx11::string::push_back(cVar3);
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar4 >> 7;
        } while (bVar1);
      }
      std::__cxx11::string::push_back(cVar3);
      pcVar2 = EpsCopyInputStream::AppendString
                         (&ctx->super_EpsCopyInputStream,pcVar2,res,this->unknown_);
      return pcVar2;
    }
    if ((long)((ctx->super_EpsCopyInputStream).buffer_end_ + (0x10 - (long)pcVar2)) < (long)(int)res
       ) {
      pcVar2 = EpsCopyInputStream::SkipFallback(&ctx->super_EpsCopyInputStream,pcVar2,res);
      return pcVar2;
    }
    pcVar2 = pcVar2 + (int)res;
  }
  return pcVar2;
}

Assistant:

const char* ParseLengthDelimited(uint32 num, const char* ptr,
                                   ParseContext* ctx) {
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_ == nullptr) return ctx->Skip(ptr, size);
    WriteVarint(num * 8 + 2, unknown_);
    WriteVarint(size, unknown_);
    return ctx->AppendString(ptr, size, unknown_);
  }